

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O1

void parseCommandLine(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined4 *puVar4;
  int iVar5;
  char *pcVar6;
  
  gRunInfo.doGrammarCaching = false;
  gRunInfo.quiet = false;
  gRunInfo.verbose = false;
  gRunInfo.stopNow = false;
  gRunInfo.dom = false;
  gRunInfo.sax = true;
  gRunInfo.reuseParser = false;
  gRunInfo.inMemory = false;
  gRunInfo.dumpOnErr = false;
  gRunInfo.doSchema = false;
  gRunInfo.schemaFullChecking = false;
  gRunInfo.doNamespaces = false;
  gRunInfo.doInitialParse = false;
  gRunInfo.doNamespacePrefixes = false;
  gRunInfo.valScheme = Val_Auto;
  gRunInfo.numThreads = 2;
  gRunInfo.totalTime = 0;
  gRunInfo.numInputFiles = 0;
  gRunInfo.numParses = 0;
  if (1 < argc) {
    iVar5 = 1;
    do {
      pcVar6 = argv[iVar5];
      iVar1 = strcmp(pcVar6,"-quiet");
      if (iVar1 == 0) {
        gRunInfo.quiet = true;
        uVar2 = gRunInfo.numParses;
      }
      else {
        iVar1 = strcmp(pcVar6,"-verbose");
        if (iVar1 == 0) {
          gRunInfo.verbose = true;
          uVar2 = gRunInfo.numParses;
        }
        else {
          iVar1 = strncmp(pcVar6,"-v=",3);
          if (iVar1 == 0) {
            pcVar6 = pcVar6 + 3;
            iVar1 = strcmp(pcVar6,"never");
            if (iVar1 == 0) {
              gRunInfo._16_8_ = gRunInfo._16_8_ & 0xffffffff00000000;
              uVar2 = gRunInfo.numParses;
            }
            else {
              iVar1 = strcmp(pcVar6,"auto");
              if (iVar1 == 0) {
                gRunInfo.valScheme = Val_Auto;
                uVar2 = gRunInfo.numParses;
              }
              else {
                iVar1 = strcmp(pcVar6,"always");
                if (iVar1 != 0) {
                  fprintf(_stderr,"Unrecognized -v option \"%s\"\n",pcVar6);
                  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                  *puVar4 = 1;
                  __cxa_throw(puVar4,&int::typeinfo,0);
                }
                gRunInfo.valScheme = Val_Always;
                uVar2 = gRunInfo.numParses;
              }
            }
          }
          else {
            iVar1 = strcmp(pcVar6,"-v");
            if (iVar1 == 0) {
              parseCommandLine();
              uVar2 = gRunInfo.numParses;
            }
            else {
              iVar1 = strcmp(pcVar6,"-s");
              if (iVar1 == 0) {
                gRunInfo.doSchema = true;
                uVar2 = gRunInfo.numParses;
              }
              else {
                iVar1 = strcmp(pcVar6,"-f");
                if (iVar1 == 0) {
                  gRunInfo.schemaFullChecking = true;
                  uVar2 = gRunInfo.numParses;
                }
                else {
                  iVar1 = strcmp(pcVar6,"-n");
                  if (iVar1 == 0) {
                    gRunInfo.doNamespaces = true;
                    uVar2 = gRunInfo.numParses;
                  }
                  else {
                    iVar1 = strcmp(pcVar6,"-p");
                    if (iVar1 == 0) {
                      gRunInfo.doNamespacePrefixes = true;
                      uVar2 = gRunInfo.numParses;
                    }
                    else {
                      iVar1 = strncmp(pcVar6,"-parser=",8);
                      if (iVar1 == 0) {
                        pcVar6 = pcVar6 + 8;
                        iVar1 = strcmp(pcVar6,"dom");
                        if (iVar1 == 0) {
                          gRunInfo.dom = true;
                          gRunInfo.sax = false;
                          uVar2 = gRunInfo.numParses;
                        }
                        else {
                          iVar1 = strcmp(pcVar6,"sax");
                          if (iVar1 == 0) {
                            gRunInfo.dom = false;
                            gRunInfo.sax = true;
                            uVar2 = gRunInfo.numParses;
                          }
                          else {
                            iVar1 = strcmp(pcVar6,"sax2");
                            if (iVar1 != 0) {
                              fprintf(_stderr,"Unrecognized -parser option \"%s\"\n",pcVar6);
                              puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                              *puVar4 = 1;
                              __cxa_throw(puVar4,&int::typeinfo,0);
                            }
                            gRunInfo.dom = false;
                            gRunInfo.sax = false;
                            uVar2 = gRunInfo.numParses;
                          }
                        }
                      }
                      else {
                        iVar1 = strcmp(pcVar6,"-init");
                        if (iVar1 == 0) {
                          gRunInfo.doInitialParse = true;
                          uVar2 = gRunInfo.numParses;
                        }
                        else {
                          iVar1 = strcmp(pcVar6,"-reuse");
                          if (iVar1 == 0) {
                            gRunInfo.reuseParser = true;
                            uVar2 = gRunInfo.numParses;
                          }
                          else {
                            iVar1 = strcmp(pcVar6,"-dump");
                            if (iVar1 == 0) {
                              gRunInfo.dumpOnErr = true;
                              uVar2 = gRunInfo.numParses;
                            }
                            else {
                              iVar1 = strcmp(pcVar6,"-mem");
                              if (iVar1 == 0) {
                                gRunInfo.inMemory = true;
                                uVar2 = gRunInfo.numParses;
                              }
                              else {
                                iVar1 = strcmp(pcVar6,"-threads");
                                if (iVar1 == 0) {
                                  iVar5 = iVar5 + 1;
                                  if (argc <= iVar5) {
                                    parseCommandLine();
                                    goto LAB_001068fd;
                                  }
                                  iVar1 = atoi(argv[iVar5]);
                                  gRunInfo.numThreads = iVar1;
                                  uVar2 = gRunInfo.numParses;
                                  if (iVar1 < 0) {
                                    parseCommandLine();
                                    goto LAB_001068fd;
                                  }
                                }
                                else {
                                  iVar1 = strcmp(pcVar6,"-time");
                                  if (iVar1 == 0) {
                                    iVar5 = iVar5 + 1;
                                    if (argc <= iVar5) {
                                      parseCommandLine();
                                      goto LAB_001068fd;
                                    }
                                    iVar1 = atoi(argv[iVar5]);
                                    gRunInfo.totalTime = iVar1;
                                    uVar2 = gRunInfo.numParses;
                                    if (iVar1 < 1) {
                                      parseCommandLine();
                                      goto LAB_001068fd;
                                    }
                                  }
                                  else {
                                    iVar1 = strcmp(pcVar6,"-gc");
                                    if (iVar1 == 0) {
                                      gRunInfo.doGrammarCaching = true;
                                      uVar2 = gRunInfo.numParses;
                                    }
                                    else {
                                      iVar1 = strcmp(pcVar6,"-parses");
                                      if (iVar1 == 0) {
                                        iVar5 = iVar5 + 1;
                                        if (argc <= iVar5) {
                                          parseCommandLine();
                                          goto LAB_001068fd;
                                        }
                                        uVar2 = atoi(argv[iVar5]);
                                        if ((int)uVar2 < 0) {
                                          fwrite("Invalid -parses option (negative # of parses)\n",
                                                 0x2e,1,_stderr);
                                          puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                          *puVar4 = 1;
                                          __cxa_throw(puVar4,&int::typeinfo,0);
                                        }
                                      }
                                      else {
                                        if (*pcVar6 == '-') {
                                          fprintf(_stderr,
                                                  "Unrecognized command line option.  Scanning \"%s\"\n"
                                                  ,pcVar6);
                                          goto LAB_001068fd;
                                        }
                                        lVar3 = (long)gRunInfo.numInputFiles;
                                        gRunInfo.numInputFiles = gRunInfo.numInputFiles + 1;
                                        if (0x17 < lVar3) {
                                          parseCommandLine();
                                          goto LAB_001068fd;
                                        }
                                        gRunInfo.files[lVar3].fileName = pcVar6;
                                        uVar2 = gRunInfo.numParses;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      gRunInfo.numParses = uVar2;
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  if (gRunInfo.numInputFiles != 0) {
    if ((gRunInfo.numParses != 0) && (gRunInfo.totalTime != 0)) {
      parseCommandLine();
    }
    return;
  }
  parseCommandLine();
LAB_001068fd:
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 1;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void parseCommandLine(int argc, char **argv)
{
    gRunInfo.doGrammarCaching = false;
    gRunInfo.quiet = false;               // Set up defaults for run.
    gRunInfo.verbose = false;
    gRunInfo.stopNow = false;
    gRunInfo.dom = false;
    gRunInfo.sax = true;
    gRunInfo.reuseParser = false;
    gRunInfo.inMemory = false;
    gRunInfo.dumpOnErr = false;
    gRunInfo.doSchema = false;
    gRunInfo.schemaFullChecking = false;
    gRunInfo.doNamespaces = false;
    gRunInfo.doInitialParse = false;
    gRunInfo.doNamespacePrefixes = false;

    gRunInfo.valScheme = SAXParser::Val_Auto;
    gRunInfo.numThreads = 2;
    gRunInfo.totalTime = 0;
    gRunInfo.numInputFiles = 0;
    gRunInfo.numParses = 0;

    try             // Use exceptions for command line syntax errors.
    {
        int argnum = 1;
        while (argnum < argc) {
            if (strcmp(argv[argnum], "-quiet") == 0)
                gRunInfo.quiet = true;
            else if (strcmp(argv[argnum], "-verbose") == 0)
                gRunInfo.verbose = true;
            else if (strncmp(argv[argnum], "-v=", 3) == 0) {
                const char* const parm = &argv[argnum][3];
                if (!strcmp(parm, "never"))
                    gRunInfo.valScheme = SAXParser::Val_Never;
                else if (!strcmp(parm, "auto"))
                    gRunInfo.valScheme = SAXParser::Val_Auto;
                else if (!strcmp(parm, "always"))
                    gRunInfo.valScheme = SAXParser::Val_Always;
                else {
                    fprintf(stderr, "Unrecognized -v option \"%s\"\n", parm);
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-v") == 0) {
                fprintf(stderr, "Please note the -v option has been changed to -v=[always | never | auto]\n");
                fprintf(stderr, "ThreadTest will continue with -v=always\n");
                gRunInfo.valScheme = SAXParser::Val_Always;
            }
            else if (strcmp(argv[argnum], "-s") == 0)
                gRunInfo.doSchema = true;
            else if (strcmp(argv[argnum], "-f") == 0)
                gRunInfo.schemaFullChecking = true;
            else if (strcmp(argv[argnum], "-n") == 0)
                gRunInfo.doNamespaces = true;
            else if (strcmp(argv[argnum], "-p") == 0)
                gRunInfo.doNamespacePrefixes = true;
            else if (!strncmp(argv[argnum], "-parser=", 8)) {
                const char* const parm = &argv[argnum][8];
                if (!strcmp(parm, "dom")) {
                    gRunInfo.dom = true;
                    gRunInfo.sax = false;
                }
                else if (!strcmp(parm, "sax")) {
                    gRunInfo.dom = false;
                    gRunInfo.sax = true;
                }
                else if (!strcmp(parm, "sax2")) {
                    gRunInfo.dom = false;
                    gRunInfo.sax = false;
                }
                else {
                    fprintf(stderr, "Unrecognized -parser option \"%s\"\n", parm);
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-init") == 0)
                gRunInfo.doInitialParse = true;
            else if (strcmp(argv[argnum], "-reuse") == 0)
                gRunInfo.reuseParser = true;
            else if (strcmp(argv[argnum], "-dump") == 0)
                gRunInfo.dumpOnErr = true;
            else if (strcmp(argv[argnum], "-mem") == 0)
                gRunInfo.inMemory = true;
            else if (strcmp(argv[argnum], "-threads") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -threads option (missing # of threads)\n");
                    throw 1;
                }
                gRunInfo.numThreads = atoi(argv[argnum]);
                if (gRunInfo.numThreads < 0) {
                    fprintf(stderr, "Invalid -threads option (negative # of threads)\n");
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-time") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -time option (missing time value)\n");
                    throw 1;
                }
                gRunInfo.totalTime = atoi(argv[argnum]);
                if (gRunInfo.totalTime < 1) {
                    fprintf(stderr, "Invalid -time option (time value < 1)\n");
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-gc") == 0)
                gRunInfo.doGrammarCaching = true;
            else if (strcmp(argv[argnum], "-parses") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -parses option (missing # of parses)\n");
                    throw 1;
                }
                int temp = atoi(argv[argnum]);
                if (temp < 0) {
                    fprintf(stderr, "Invalid -parses option (negative # of parses)\n");
                    throw 1;
                }
                gRunInfo.numParses = temp;
            }
            else  if (argv[argnum][0] == '-') {
                fprintf(stderr, "Unrecognized command line option.  Scanning \"%s\"\n",
                    argv[argnum]);
                throw 1;
            }
            else {
                gRunInfo.numInputFiles++;
                if (gRunInfo.numInputFiles >= MAXINFILES) {
                    fprintf(stderr, "Too many input files.  Limit is %d\n", MAXINFILES);
                    throw 1;
                }
                gRunInfo.files[gRunInfo.numInputFiles-1].fileName = argv[argnum];
            }
            argnum++;
        }

        // We've made it through the command line.
        // Verify that at least one input file to be parsed was specified.
        if (gRunInfo.numInputFiles == 0) {
            fprintf(stderr, "No input XML file specified on command line.\n");
            throw 1;
        };

        if (gRunInfo.numParses && gRunInfo.totalTime) {
            fprintf(stderr, "Both -parses nnn and -time nnn were specified. Ignoring -time nnn.\n");
        }
    }
    catch (int)
    {
        fprintf(stderr, "usage:  ThreadTest [-v] [-threads nnn] [-time nnn] [-quiet] [-verbose] xmlfile...\n"
            "     -v=xxx         Validation scheme [always | never | auto].  Default is AUTO.\n"
            "     -n             Enable namespace processing. Defaults to off.\n"
            "     -s             Enable schema processing. Defaults to off.\n"
            "     -f             Enable full schema constraint checking. Defaults to off.\n"
            "     -parser=xxx    Parser Type [dom | sax | sax2].  Default is SAX (SAX1).\n"
            "     -p             Enable namespace prefixes. Defaults to off.\n"
            "                    (Only used with -parser=sax2, ignored otherwise.)\n"
            "     -quiet         Suppress periodic status display.\n"
            "     -verbose       Display extra messages.\n"
            "     -reuse         Retain and reuse parser.  Default creates new for each parse.\n"
            "     -threads nnn   Number of threads.  Default is 2.\n"
            "     -time nnn      Total time to run, in seconds.  Default is forever.\n"
            "     -parses nnn    Run for nnn parses instead of time.  Default is to use time\n"
            "     -dump          Dump DOM tree on error.\n"
            "     -mem           Read files into memory once only, and parse them from there.\n"
            "     -gc            Enable grammar caching (i.e. grammar cached and used in subsequent parses). Defaults to off.\n"
            "     -init          Perform an initial parse of the file(s) before starting up the individual threads.\n\n"
            );
        exit(1);
    }
}